

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t best_effort_strncat_in_locale
                  (archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  archive_string *paVar1;
  wchar_t local_54;
  ulong uStack_50;
  wchar_t return_value;
  size_t avail;
  uint8_t *itp;
  char *otp;
  size_t remaining;
  archive_string_conv *sc_local;
  size_t length_local;
  void *_p_local;
  archive_string *as_local;
  
  local_54 = L'\0';
  if (sc->same == L'\0') {
    paVar1 = archive_string_ensure(as,as->length + length + 1);
    if (paVar1 == (archive_string *)0x0) {
      as_local._4_4_ = L'\xffffffff';
    }
    else {
      itp = (uint8_t *)(as->s + as->length);
      uStack_50 = (as->buffer_length - as->length) - 1;
      otp = (char *)length;
      for (avail = (size_t)_p; *(char *)avail != '\0' && otp != (char *)0x0; avail = avail + 1) {
        if ((*(byte *)avail < 0x80) || ((sc->flag & 0x100U) == 0)) {
          if (*(byte *)avail < 0x80) {
            *itp = *(uint8_t *)avail;
          }
          else {
            *itp = '?';
            local_54 = L'\xffffffff';
          }
          itp = itp + 1;
        }
        else {
          if (uStack_50 < 3) {
            as->length = (long)itp - (long)as->s;
            paVar1 = archive_string_ensure(as,(size_t)(otp + as->buffer_length + 3));
            if (paVar1 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            itp = (uint8_t *)(as->s + as->length);
            uStack_50 = (as->buffer_length - as->length) - 1;
          }
          *itp = 0xef;
          itp[1] = 0xbf;
          itp[2] = 0xbd;
          itp = itp + 3;
          uStack_50 = uStack_50 - 3;
          local_54 = L'\xffffffff';
        }
        otp = otp + -1;
      }
      as->length = (long)itp - (long)as->s;
      as->s[as->length] = '\0';
      as_local._4_4_ = local_54;
    }
  }
  else {
    paVar1 = archive_string_append(as,(char *)_p,length);
    if (paVar1 == (archive_string *)0x0) {
      as_local._4_4_ = L'\xffffffff';
    }
    else {
      as_local._4_4_ = invalid_mbs(_p,length,sc);
    }
  }
  return as_local._4_4_;
}

Assistant:

static int
best_effort_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	size_t remaining;
	char *otp;
	const uint8_t *itp;
	size_t avail;
	int return_value = 0; /* success */

	/*
	 * If both from-locale and to-locale is the same, this makes a copy.
	 * And then this checks all copied MBS can be WCS if so returns 0.
	 */
	if (sc->same) {
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (invalid_mbs(_p, length, sc));
	}

	/*
	 * If a character is ASCII, this just copies it. If not, this
	 * assigns '?' charater instead but in UTF-8 locale this assigns
	 * byte sequence 0xEF 0xBD 0xBD, which are code point U+FFFD,
	 * a Replacement Character in Unicode.
	 */
	if (archive_string_ensure(as, as->length + length + 1) == NULL)
		return (-1);

	remaining = length;
	itp = (const uint8_t *)_p;
	otp = as->s + as->length;
	avail = as->buffer_length - as->length -1;
	while (*itp && remaining > 0) {
		if (*itp > 127 && (sc->flag & SCONV_TO_UTF8)) {
			if (avail < UTF8_R_CHAR_SIZE) {
				as->length = otp - as->s;
				if (NULL == archive_string_ensure(as,
				    as->buffer_length + remaining +
				    UTF8_R_CHAR_SIZE))
					return (-1);
				otp = as->s + as->length;
				avail = as->buffer_length - as->length -1;
			}
			/*
		 	 * When coping a string in UTF-8, unknown character
			 * should be U+FFFD (replacement character).
			 */
			UTF8_SET_R_CHAR(otp);
			otp += UTF8_R_CHAR_SIZE;
			avail -= UTF8_R_CHAR_SIZE;
			itp++;
			remaining--;
			return_value = -1;
		} else if (*itp > 127) {
			*otp++ = '?';
			itp++;
			remaining--;
			return_value = -1;
		} else {
			*otp++ = (char)*itp++;
			remaining--;
		}
	}
	as->length = otp - as->s;
	as->s[as->length] = '\0';
	return (return_value);
}